

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

void __thiscall
fmt::BufferedFile::BufferedFile(BufferedFile *this,CStringRef filename,CStringRef mode)

{
  char *__filename;
  char *__modes;
  FILE *pFVar1;
  int *piVar2;
  undefined8 uVar3;
  long *in_RDI;
  bool bVar4;
  BasicCStringRef<char> *in_stack_00000008;
  int in_stack_00000014;
  SystemError *in_stack_00000018;
  CStringRef in_stack_00000020;
  BasicCStringRef<char> local_20 [2];
  BasicCStringRef<char> local_10;
  BasicCStringRef<char> local_8;
  
  do {
    __filename = BasicCStringRef<char>::c_str(&local_8);
    __modes = BasicCStringRef<char>::c_str(&local_10);
    pFVar1 = fopen(__filename,__modes);
    *in_RDI = (long)pFVar1;
    bVar4 = false;
    if (*in_RDI == 0) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
  } while (bVar4);
  if (*in_RDI == 0) {
    uVar3 = __cxa_allocate_exception(0x18);
    __errno_location();
    BasicCStringRef<char>::BasicCStringRef(local_20,"cannot open file {}");
    SystemError::SystemError<fmt::BasicCStringRef<char>>
              (in_stack_00000018,in_stack_00000014,in_stack_00000020,in_stack_00000008);
    __cxa_throw(uVar3,&SystemError::typeinfo,SystemError::~SystemError);
  }
  return;
}

Assistant:

fmt::BufferedFile::BufferedFile(
    fmt::CStringRef filename, fmt::CStringRef mode) {
  FMT_RETRY_VAL(file_, FMT_SYSTEM(fopen(filename.c_str(), mode.c_str())), 0);
  if (!file_)
    FMT_THROW(SystemError(errno, "cannot open file {}", filename));
}